

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_profiler.cpp
# Opt level: O2

void __thiscall
duckdb::OperatorProfiler::StartOperator
          (OperatorProfiler *this,optional_ptr<const_duckdb::PhysicalOperator,_true> phys_op)

{
  optional_ptr<const_duckdb::PhysicalOperator,_true> *this_00;
  bool bVar1;
  PhysicalOperator *pPVar2;
  OperatorInformation *pOVar3;
  InternalException *this_01;
  allocator local_79;
  InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  params;
  
  if (this->enabled == true) {
    if ((this->active_operator).ptr != (PhysicalOperator *)0x0) {
      this_01 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&params,
                 "OperatorProfiler: Attempting to call StartOperator while another operator is active"
                 ,&local_79);
      InternalException::InternalException(this_01,(string *)&params);
      __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    (this->active_operator).ptr = phys_op.ptr;
    if ((this->settings)._M_h._M_element_count != 0) {
      bVar1 = ProfilingInfo::Enabled(&this->settings,EXTRA_INFO);
      if (bVar1) {
        this_00 = &this->active_operator;
        pPVar2 = optional_ptr<const_duckdb::PhysicalOperator,_true>::operator*(this_00);
        bVar1 = OperatorInfoIsInitialized(this,pPVar2);
        if (!bVar1) {
          pPVar2 = optional_ptr<const_duckdb::PhysicalOperator,_true>::operator*(this_00);
          pOVar3 = GetOperatorInfo(this,pPVar2);
          pPVar2 = optional_ptr<const_duckdb::PhysicalOperator,_true>::operator->(this_00);
          (*pPVar2->_vptr_PhysicalOperator[3])(&params,pPVar2);
          InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator=(&pOVar3->extra_info,&params);
          InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~InsertionOrderPreservingMap(&params);
        }
      }
      bVar1 = ProfilingInfo::Enabled(&this->settings,OPERATOR_TIMING);
      if (bVar1) {
        BaseProfiler<std::chrono::_V2::steady_clock>::Start(&this->op);
      }
    }
  }
  return;
}

Assistant:

void OperatorProfiler::StartOperator(optional_ptr<const PhysicalOperator> phys_op) {
	if (!enabled) {
		return;
	}
	if (active_operator) {
		throw InternalException("OperatorProfiler: Attempting to call StartOperator while another operator is active");
	}
	active_operator = phys_op;

	if (!settings.empty()) {
		if (ProfilingInfo::Enabled(settings, MetricsType::EXTRA_INFO)) {
			if (!OperatorInfoIsInitialized(*active_operator)) {
				// first time calling into this operator - fetch the info
				auto &info = GetOperatorInfo(*active_operator);
				auto params = active_operator->ParamsToString();
				info.extra_info = params;
			}
		}

		// Start the timing of the current operator.
		if (ProfilingInfo::Enabled(settings, MetricsType::OPERATOR_TIMING)) {
			op.Start();
		}
	}
}